

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoftp.c
# Opt level: O3

void xmlNanoFTPScanURL(void *ctx,char *URL)

{
  xmlURIPtr uri;
  char *pcVar1;
  xmlChar *pxVar2;
  long lVar3;
  
  if (*ctx != (void *)0x0) {
    (*xmlFree)(*ctx);
    *(undefined8 *)ctx = 0;
  }
  if (*(void **)((long)ctx + 8) != (void *)0x0) {
    (*xmlFree)(*(void **)((long)ctx + 8));
    *(undefined8 *)((long)ctx + 8) = 0;
  }
  if (*(void **)((long)ctx + 0x18) != (void *)0x0) {
    (*xmlFree)(*(void **)((long)ctx + 0x18));
    *(undefined8 *)((long)ctx + 0x18) = 0;
  }
  uri = xmlParseURIRaw(URL,1);
  if (uri != (xmlURIPtr)0x0) {
    if ((uri->scheme != (char *)0x0) && (uri->server != (char *)0x0)) {
      pcVar1 = (*xmlMemStrdup)(uri->scheme);
      *(char **)ctx = pcVar1;
      pcVar1 = (*xmlMemStrdup)(uri->server);
      *(char **)((long)ctx + 8) = pcVar1;
      pcVar1 = "/";
      if (uri->path != (char *)0x0) {
        pcVar1 = uri->path;
      }
      pcVar1 = (*xmlMemStrdup)(pcVar1);
      *(char **)((long)ctx + 0x18) = pcVar1;
      if (uri->port != 0) {
        *(int *)((long)ctx + 0x10) = uri->port;
      }
      pxVar2 = (xmlChar *)uri->user;
      if (pxVar2 != (xmlChar *)0x0) {
        pcVar1 = strchr((char *)pxVar2,0x3a);
        if (pcVar1 == (char *)0x0) {
          pcVar1 = (*xmlMemStrdup)((char *)pxVar2);
          lVar3 = 0x20;
        }
        else {
          pxVar2 = xmlStrndup(pxVar2,(int)pcVar1 - (int)pxVar2);
          *(xmlChar **)((long)ctx + 0x20) = pxVar2;
          pcVar1 = (*xmlMemStrdup)(pcVar1 + 1);
          lVar3 = 0x28;
        }
        *(char **)((long)ctx + lVar3) = pcVar1;
      }
    }
    xmlFreeURI(uri);
    return;
  }
  return;
}

Assistant:

static void
xmlNanoFTPScanURL(void *ctx, const char *URL) {
    xmlNanoFTPCtxtPtr ctxt = (xmlNanoFTPCtxtPtr) ctx;
    xmlURIPtr uri;

    /*
     * Clear any existing data from the context
     */
    if (ctxt->protocol != NULL) {
        xmlFree(ctxt->protocol);
	ctxt->protocol = NULL;
    }
    if (ctxt->hostname != NULL) {
        xmlFree(ctxt->hostname);
	ctxt->hostname = NULL;
    }
    if (ctxt->path != NULL) {
        xmlFree(ctxt->path);
	ctxt->path = NULL;
    }
    if (URL == NULL) return;

    uri = xmlParseURIRaw(URL, 1);
    if (uri == NULL)
	return;

    if ((uri->scheme == NULL) || (uri->server == NULL)) {
	xmlFreeURI(uri);
	return;
    }

    ctxt->protocol = xmlMemStrdup(uri->scheme);
    ctxt->hostname = xmlMemStrdup(uri->server);
    if (uri->path != NULL)
	ctxt->path = xmlMemStrdup(uri->path);
    else
	ctxt->path = xmlMemStrdup("/");
    if (uri->port != 0)
	ctxt->port = uri->port;

    if (uri->user != NULL) {
	char *cptr;
	if ((cptr=strchr(uri->user, ':')) == NULL)
	    ctxt->user = xmlMemStrdup(uri->user);
	else {
	    ctxt->user = (char *)xmlStrndup((xmlChar *)uri->user,
			    (cptr - uri->user));
	    ctxt->passwd = xmlMemStrdup(cptr+1);
	}
    }

    xmlFreeURI(uri);

}